

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer.cpp
# Opt level: O0

void __thiscall dynamicgraph::Tracer::closeFiles(Tracer *this)

{
  bool bVar1;
  reference ppbVar2;
  ostream *filePtr;
  _Self local_20;
  iterator iter;
  lock_guard<std::mutex> files_lock;
  Tracer *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&iter,&this->files_mtx);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
       ::begin(&this->files);
  while( true ) {
    filePtr = (ostream *)
              std::__cxx11::
              list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              ::end(&this->files);
    bVar1 = std::operator!=((_Self *)&filePtr,&local_20);
    if (!bVar1) break;
    ppbVar2 = std::_List_iterator<std::basic_ostream<char,_std::char_traits<char>_>_*>::operator*
                        (&local_20);
    if (*ppbVar2 != (basic_ostream<char,_std::char_traits<char>_> *)0x0) {
      (**(code **)(*(long *)*ppbVar2 + 8))();
    }
    std::_List_iterator<std::basic_ostream<char,_std::char_traits<char>_>_*>::operator++(&local_20);
  }
  std::__cxx11::
  list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::clear(&this->files);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&iter);
  return;
}

Assistant:

void Tracer::closeFiles() {
  dgDEBUGIN(15);
  std::lock_guard<std::mutex> files_lock(files_mtx);

  for (FileList::iterator iter = files.begin(); files.end() != iter; ++iter) {
    std::ostream *filePtr = *iter;
    delete filePtr;
  }
  files.clear();

  dgDEBUGOUT(15);
}